

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_pack16to1.h
# Opt level: O0

void ncnn::convolution_pack16to1_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  float *pfVar6;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar7;
  undefined1 auVar8 [16];
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m512 _w;
  __m512 _val;
  int k;
  float *sptr;
  Mat m_2;
  int q;
  float *kptr;
  __m512 _sum;
  float sum;
  int j_1;
  int i_1;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  Mat *m;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  Mat *m_3;
  Mat *m_1;
  __m128 x32;
  __m128 x64;
  __m128 x128;
  __m256 x256;
  float in_stack_fffffffffffff618;
  float fVar9;
  float in_stack_fffffffffffff61c;
  size_type in_stack_fffffffffffff620;
  undefined4 in_stack_fffffffffffff628;
  undefined4 in_stack_fffffffffffff62c;
  int local_8ac;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_890;
  undefined4 local_888;
  long local_880;
  undefined4 local_878;
  undefined4 local_874;
  undefined4 local_870;
  undefined4 local_86c;
  undefined4 local_868;
  undefined8 local_860;
  int local_854;
  undefined8 local_850;
  undefined8 local_848;
  undefined8 local_840;
  undefined4 local_838;
  long local_830;
  int local_828;
  undefined4 local_824;
  undefined4 local_820;
  undefined4 local_81c;
  undefined4 local_818;
  ulong local_810;
  undefined1 (*local_808) [64];
  undefined1 local_800 [64];
  float local_794;
  int local_790;
  int local_78c;
  undefined8 local_788;
  undefined8 local_780;
  undefined8 local_778;
  undefined4 local_770;
  long local_768;
  undefined4 local_760;
  undefined4 local_75c;
  undefined4 local_758;
  undefined4 local_754;
  undefined4 local_750;
  undefined8 local_748;
  float *local_740;
  int local_734;
  long local_730;
  int local_724;
  int local_720;
  int local_71c;
  int local_718;
  int local_714;
  reference local_710;
  vector<int,_std::allocator<int>_> local_6f0;
  int local_6d8;
  int local_6d4;
  int local_6d0;
  int local_6cc;
  int local_6c8;
  int local_6c4;
  int local_6c0;
  int local_6bc;
  long *local_6b8;
  long *local_6b0;
  long *local_6a8;
  long *local_6a0;
  undefined8 *local_698;
  undefined8 *local_688;
  undefined8 *local_678;
  undefined8 *local_650;
  undefined1 local_630 [32];
  undefined8 *local_610;
  undefined1 local_605;
  int local_604;
  undefined8 *local_5f8;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  long *local_5c8;
  int local_5bc;
  undefined8 *local_5b8;
  float local_5ac;
  float local_5a8;
  float local_5a4;
  float local_5a0;
  float local_59c;
  float local_598;
  float local_594;
  float local_590;
  float local_58c;
  long *local_588;
  int local_580;
  float local_57c [3];
  long *local_570;
  undefined8 local_568;
  long *local_560;
  undefined8 local_558;
  long *local_550;
  undefined8 local_548;
  long *local_540;
  undefined8 local_538;
  long *local_530;
  undefined1 local_525;
  int local_524;
  undefined8 *local_518;
  undefined1 local_4f5;
  int local_4f4;
  undefined8 *local_4e8;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 (*local_390) [64];
  undefined1 (*local_388) [64];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  ulong local_310;
  undefined8 uStack_308;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float local_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  undefined1 local_150 [16];
  ulong local_140;
  undefined8 uStack_138;
  long local_128;
  undefined4 local_11c;
  ulong local_118;
  undefined1 (*local_110) [64];
  undefined4 local_104;
  int local_100;
  int local_fc;
  undefined8 *local_f8;
  long local_f0;
  undefined4 local_e4;
  long local_e0;
  long local_d8;
  undefined4 local_cc;
  int local_c8;
  int local_c4;
  undefined8 *local_c0;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  float *local_a0;
  undefined4 local_94;
  int local_90;
  int local_8c;
  undefined8 *local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  
  local_6c4 = *(int *)((long)in_RDI + 0x2c);
  local_6c8 = (int)in_RDI[7];
  local_6cc = *(int *)((long)in_RSI + 0x2c);
  local_6d0 = (int)in_RSI[6];
  local_6d4 = (int)in_RSI[7];
  local_6d8 = in_R8D * in_R9D;
  local_6c0 = in_R9D;
  local_6bc = in_R8D;
  local_6b8 = in_RCX;
  local_6b0 = in_RDX;
  local_6a8 = in_RSI;
  local_6a0 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x3c859d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628),in_stack_fffffffffffff620
             ,(allocator_type *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
  std::allocator<int>::~allocator((allocator<int> *)0x3c85c9);
  local_710 = std::vector<int,_std::allocator<int>_>::operator[](&local_6f0,0);
  local_714 = 0;
  local_718 = 0;
  local_71c = local_6c4 * dilation_w - local_6bc * in_stack_00000008;
  for (local_720 = 0; local_720 < local_6c0; local_720 = local_720 + 1) {
    for (local_724 = 0; local_724 < local_6bc; local_724 = local_724 + 1) {
      local_710[local_714] = local_718;
      local_714 = local_714 + 1;
      local_718 = in_stack_00000008 + local_718;
    }
    local_718 = local_71c + local_718;
  }
  local_5c8 = local_6b8;
  local_730 = *local_6b8;
  for (local_734 = 0; local_734 < local_6d4; local_734 = local_734 + 1) {
    local_5f8 = &local_788;
    local_8c = *(int *)((long)local_6a8 + 0x2c);
    local_90 = (int)local_6a8[6];
    local_94 = *(undefined4 *)((long)local_6a8 + 0x34);
    local_740 = (float *)(*local_6a8 + local_6a8[8] * (long)local_734 * local_6a8[2]);
    local_a8 = local_6a8[2];
    local_ac = (undefined4)local_6a8[3];
    local_b8 = local_6a8[4];
    local_88 = &local_788;
    local_78 = (long)local_8c * (long)local_90 * local_a8;
    local_5d8 = &local_788;
    local_698 = &local_788;
    local_7c = 0x10;
    local_604 = local_734;
    local_605 = 1;
    local_788 = 0;
    local_778 = 0;
    local_770 = 0;
    local_760 = 0;
    local_75c = 0;
    local_758 = 0;
    local_754 = 0;
    local_750 = 0;
    local_748 = 0;
    local_780 = 0;
    local_610 = local_698;
    local_a0 = local_740;
    local_768 = local_b8;
    for (local_78c = 0; local_78c < local_6d0; local_78c = local_78c + 1) {
      for (local_790 = 0; local_790 < local_6cc; local_790 = local_790 + 1) {
        local_794 = 0.0;
        if (local_730 != 0) {
          local_794 = *(float *)(local_730 + (long)local_734 * 4);
        }
        local_800 = ZEXT1664(ZEXT816(0));
        local_4e8 = &local_850;
        local_fc = *(int *)((long)local_6b0 + 0x2c);
        local_100 = (int)local_6b0[6];
        local_104 = *(undefined4 *)((long)local_6b0 + 0x34);
        local_110 = (undefined1 (*) [64])
                    (*local_6b0 + local_6b0[8] * (long)local_734 * local_6b0[2]);
        local_118 = local_6b0[2];
        local_11c = (undefined4)local_6b0[3];
        local_128 = local_6b0[4];
        local_f8 = &local_850;
        local_58 = (long)local_fc * (long)local_100 * local_118;
        local_810 = (local_58 + 0xfU & 0xfffffffffffffff0) / local_118;
        local_828 = (int)local_6b0[5] + -1;
        if ((int)local_6b0[5] == 4) {
          local_810 = (long)*(int *)((long)local_6b0 + 0x2c) * (long)(int)local_6b0[6];
        }
        local_5d0 = &local_850;
        local_688 = &local_850;
        local_5c = 0x10;
        uStack_348 = 0;
        uStack_350 = 0;
        uStack_358 = 0;
        uStack_360 = 0;
        uStack_368 = 0;
        uStack_370 = 0;
        uStack_378 = 0;
        local_380 = 0;
        local_4f4 = local_734;
        local_4f5 = 1;
        local_850 = 0;
        local_840 = 0;
        local_838 = 0;
        local_824 = 0;
        local_820 = 0;
        local_81c = 0;
        local_818 = 0;
        local_848 = 0;
        local_808 = local_110;
        for (local_854 = 0; local_854 < local_6c8; local_854 = local_854 + 1) {
          local_518 = &local_8a0;
          local_c4 = *(int *)((long)local_6a0 + 0x2c);
          local_c8 = (int)local_6a0[6];
          local_cc = *(undefined4 *)((long)local_6a0 + 0x34);
          local_d8 = *local_6a0 + local_6a0[8] * (long)local_854 * local_6a0[2];
          local_e0 = local_6a0[2];
          local_e4 = (undefined4)local_6a0[3];
          local_f0 = local_6a0[4];
          local_c0 = &local_8a0;
          local_68 = (long)local_c4 * (long)local_c8 * local_e0;
          local_5bc = local_78c * stride_w;
          local_5b8 = &local_8a0;
          for (local_8ac = 0; local_8ac < local_6d8; local_8ac = local_8ac + 1) {
            local_388 = (undefined1 (*) [64])
                        (local_d8 + (long)local_c4 * (long)local_5bc * local_e0 +
                         (long)(local_790 * dilation_h * 0x10) * 4 +
                        (long)(local_710[local_8ac] << 4) * 4);
            local_400 = *(undefined8 *)*local_388;
            uStack_3f8 = *(undefined8 *)(*local_388 + 8);
            uStack_3f0 = *(undefined8 *)(*local_388 + 0x10);
            uStack_3e8 = *(undefined8 *)(*local_388 + 0x18);
            uStack_3e0 = *(undefined8 *)(*local_388 + 0x20);
            uStack_3d8 = *(undefined8 *)(*local_388 + 0x28);
            uStack_3d0 = *(undefined8 *)(*local_388 + 0x30);
            uStack_3c8 = *(undefined8 *)(*local_388 + 0x38);
            local_390 = local_808;
            local_440 = *(undefined8 *)*local_808;
            uStack_438 = *(undefined8 *)(*local_808 + 8);
            uStack_430 = *(undefined8 *)(*local_808 + 0x10);
            uStack_428 = *(undefined8 *)(*local_808 + 0x18);
            uStack_420 = *(undefined8 *)(*local_808 + 0x20);
            uStack_418 = *(undefined8 *)(*local_808 + 0x28);
            uStack_410 = *(undefined8 *)(*local_808 + 0x30);
            uStack_408 = *(undefined8 *)(*local_808 + 0x38);
            local_480 = local_800._0_8_;
            uStack_478 = local_800._8_8_;
            uStack_470 = local_800._16_8_;
            uStack_468 = local_800._24_8_;
            uStack_460 = local_800._32_8_;
            uStack_458 = local_800._40_8_;
            uStack_450 = local_800._48_8_;
            uStack_448 = local_800._56_8_;
            local_800 = vfmadd213ps_avx512f(*local_808,*local_388,local_800);
            local_808 = local_808 + 1;
          }
          local_678 = &local_8a0;
          local_6c = 0x10;
          local_524 = local_854;
          local_525 = 1;
          local_8a0 = 0;
          local_890 = 0;
          local_888 = 0;
          local_878 = 0;
          local_874 = 0;
          local_870 = 0;
          local_86c = 0;
          local_868 = 0;
          local_860 = 0;
          local_898 = 0;
          local_650 = local_678;
          local_880 = local_f0;
        }
        local_2c0 = local_800._0_8_;
        uStack_2b8 = local_800._8_8_;
        uStack_2b0 = local_800._16_8_;
        uStack_2a8 = local_800._24_8_;
        uStack_2a0 = local_800._32_8_;
        uStack_298 = local_800._40_8_;
        uStack_290 = local_800._48_8_;
        uStack_288 = local_800._56_8_;
        local_1c0 = local_800._0_8_;
        uStack_1b8 = local_800._8_8_;
        uStack_1b0 = local_800._16_8_;
        uStack_1a8 = local_800._24_8_;
        uStack_1a0 = local_800._32_8_;
        uStack_198 = local_800._40_8_;
        uStack_190 = local_800._48_8_;
        uStack_188 = local_800._56_8_;
        local_240 = local_800._0_8_;
        uVar2 = local_240;
        uStack_238 = local_800._8_8_;
        uVar3 = uStack_238;
        uStack_230 = local_800._16_8_;
        uVar4 = uStack_230;
        uStack_228 = local_800._24_8_;
        uVar5 = uStack_228;
        local_630 = vextractf64x4_avx512f(local_800,1);
        local_240._0_4_ = local_800._0_4_;
        local_240._4_4_ = local_800._4_4_;
        uStack_238._0_4_ = local_800._8_4_;
        uStack_238._4_4_ = local_800._12_4_;
        uStack_230._0_4_ = local_800._16_4_;
        uStack_230._4_4_ = local_800._20_4_;
        uStack_228._0_4_ = local_800._24_4_;
        uStack_228._4_4_ = local_800._28_4_;
        local_2e0 = (float)local_240 + local_260;
        fStack_2dc = local_240._4_4_ + fStack_25c;
        fStack_2d8 = (float)uStack_238 + fStack_258;
        fStack_2d4 = uStack_238._4_4_ + fStack_254;
        fStack_2d0 = (float)uStack_230 + fStack_250;
        fStack_2cc = uStack_230._4_4_ + fStack_24c;
        fStack_2c8 = (float)uStack_228 + fStack_248;
        fStack_2c4 = uStack_228._4_4_ + fStack_244;
        local_180 = CONCAT44(fStack_2dc,local_2e0);
        uStack_178 = CONCAT44(fStack_2d4,fStack_2d8);
        uStack_170 = CONCAT44(fStack_2cc,fStack_2d0);
        uStack_168 = CONCAT44(fStack_2c4,fStack_2c8);
        uStack_1c8 = CONCAT44(fStack_2c4,fStack_2c8);
        local_1d0 = CONCAT44(fStack_2cc,fStack_2d0);
        local_2f0 = fStack_2d0 + local_1e0;
        fStack_2ec = fStack_2cc + fStack_1dc;
        fStack_2e8 = fStack_2c8 + fStack_1d8;
        fStack_2e4 = fStack_2c4 + fStack_1d4;
        local_220 = CONCAT44(fStack_2ec,local_2f0);
        uStack_218 = CONCAT44(fStack_2e4,fStack_2e8);
        auVar1._8_8_ = uStack_218;
        auVar1._0_8_ = local_220;
        auVar8._8_8_ = uStack_218;
        auVar8._0_8_ = local_220;
        _local_200 = vunpckhpd_avx(auVar8,auVar1);
        local_300 = local_2f0 + (float)local_200._0_4_;
        fStack_2fc = fStack_2ec + (float)local_200._4_4_;
        fStack_2f8 = fStack_2e8 + fStack_1f8;
        fStack_2f4 = fStack_2e4 + fStack_1f4;
        local_150._0_4_ = local_300 + fStack_2fc;
        auVar8 = ZEXT416((uint)local_150._0_4_);
        local_150._4_4_ = 0;
        local_310 = local_150._0_8_;
        uStack_308 = 0;
        local_140 = local_150._0_8_;
        uStack_138 = 0;
        fVar9 = local_794 + (float)local_150._0_4_;
        local_588 = (long *)CONCAT44(in_stack_00000034,activation_type);
        local_580 = stride_h;
        local_57c[0] = fVar9;
        local_240 = uVar2;
        uStack_238 = uVar3;
        uStack_230 = uVar4;
        uStack_228 = uVar5;
        local_210 = local_220;
        uStack_208 = uStack_218;
        local_1f0 = local_220;
        uStack_1e8 = uStack_218;
        local_160 = fStack_2fc;
        fStack_15c = fStack_2fc;
        fStack_158 = fStack_2fc;
        fStack_154 = fStack_2fc;
        local_150 = auVar8;
        local_830 = local_128;
        local_794 = fVar9;
        switch(stride_h) {
        case 1:
          dVar7 = std::fmax((double)(ulong)(uint)fVar9,0.0);
          local_57c[0] = SUB84(dVar7,0);
          break;
        case 2:
          local_538 = 0;
          local_58c = *(float *)*local_588;
          in_stack_fffffffffffff61c = fVar9;
          local_530 = local_588;
          if (fVar9 <= 0.0) {
            in_stack_fffffffffffff61c = fVar9 * local_58c;
            local_57c[0] = fVar9 * local_58c;
          }
          break;
        case 3:
          local_548 = 0;
          local_590 = *(float *)*local_588;
          local_558 = 1;
          local_594 = *(float *)(*local_588 + 4);
          if (fVar9 < local_590) {
            local_57c[0] = local_590;
          }
          local_550 = local_588;
          local_540 = local_588;
          if (local_594 < local_57c[0]) {
            local_57c[0] = local_594;
          }
          break;
        case 4:
          local_598 = 88.37626;
          pfVar6 = std::min<float>(local_57c,&local_598);
          local_57c[0] = *pfVar6;
          local_59c = -88.37626;
          pfVar6 = std::max<float>(local_57c,&local_59c);
          local_57c[0] = *pfVar6;
          dVar7 = std::exp((double)(ulong)(uint)-local_57c[0]);
          local_57c[0] = 1.0 / (SUB84(dVar7,0) + 1.0);
          break;
        case 5:
          dVar7 = std::exp((double)(ulong)(uint)fVar9);
          dVar7 = std::log((double)(ulong)(uint)(SUB84(dVar7,0) + 1.0));
          dVar7 = std::tanh(dVar7);
          in_stack_fffffffffffff618 = fVar9;
          local_57c[0] = fVar9 * SUB84(dVar7,0);
          break;
        case 6:
          local_568 = 0;
          local_5a0 = *(float *)*local_588;
          local_57c[1] = 1.4013e-45;
          local_57c[2] = 0.0;
          local_5a4 = *(float *)(*local_588 + 4);
          local_5a8 = -local_5a4 / local_5a0;
          local_5ac = 1.0 / local_5a0 + local_5a8;
          local_570 = local_588;
          local_560 = local_588;
          if (local_5a8 <= fVar9) {
            if (fVar9 <= local_5ac) {
              local_57c[0] = fVar9 * (fVar9 * local_5a0 + local_5a4);
            }
          }
          else {
            local_57c[0] = 0.0;
          }
        }
        local_794 = local_57c[0];
        *local_740 = local_57c[0];
        local_740 = local_740 + 1;
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
  return;
}

Assistant:

static void convolution_pack16to1_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_data_ptr)
                {
                    sum = bias_data_ptr[p];
                }

                __m512 _sum = _mm512_setzero_ps();

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                    for (int k = 0; k < maxk; k++)
                    {
                        __m512 _val = _mm512_load_ps(sptr + space_ofs[k] * 16);
                        __m512 _w = _mm512_load_ps(kptr);
                        _sum = _mm512_fmadd_ps(_val, _w, _sum);

                        kptr += 16;
                    }
                }

                sum += _mm512_comp_reduce_add_ps(_sum);

                sum = activation_ss(sum, activation_type, activation_params);

                outptr[0] = sum;
                outptr += 1;
            }
        }
    }
}